

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode singleipconnect(Curl_easy *data,connectdata *conn,Curl_addrinfo *ai,int tempindex)

{
  undefined1 *puVar1;
  _Bool _Var2;
  uchar uVar3;
  sa_family_t sVar4;
  CURLcode CVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  if2ip_result_t iVar9;
  int iVar10;
  int *piVar11;
  undefined8 extraout_RAX;
  size_t sVar12;
  uint *puVar13;
  long lVar14;
  ushort uVar15;
  char *pcVar16;
  long lVar17;
  ushort uVar18;
  char *pcVar19;
  bool bVar20;
  bool bVar21;
  curltime cVar22;
  curl_socket_t sockfd;
  Curl_dns_entry *h;
  int optval;
  int port;
  int on;
  curl_socklen_t size;
  curl_socklen_t onoff;
  char ipaddress [46];
  char buffer [256];
  Curl_sockaddr_ex addr;
  Curl_sockaddr_storage add;
  socklen_t local_354;
  uint local_348;
  uchar local_341;
  char *local_340;
  uint local_334;
  connectdata *local_330;
  Curl_dns_entry *local_328;
  int local_31c;
  undefined4 local_318;
  undefined4 local_314;
  uint local_310;
  undefined4 local_30c;
  long local_308;
  socklen_t local_2fc;
  sockaddr local_2f8;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  char local_278 [48];
  int local_248 [64];
  undefined1 local_148 [144];
  sockaddr local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_314 = 1;
  lVar17 = (long)tempindex;
  conn->tempsock[lVar17] = -1;
  CVar5 = Curl_socket(data,ai,(Curl_sockaddr_ex *)local_148,(curl_socket_t *)&local_348);
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  _Var2 = Curl_addr2string((sockaddr *)(local_148 + 0x10),local_148._12_4_,local_278,
                           (int *)&local_310);
  if (!_Var2) {
    puVar13 = (uint *)__errno_location();
    uVar8 = *puVar13;
    pcVar16 = Curl_strerror(uVar8,(char *)local_248,0x100);
    Curl_failf(data,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar8,pcVar16);
    Curl_closesocket(data,conn,local_348);
    return CURLE_OK;
  }
  pcVar16 = "  Trying %s:%d...";
  if (local_148._0_4_ == 10) {
    pcVar16 = "  Trying [%s]:%d...";
  }
  iVar7 = 0;
  Curl_infof(data,pcVar16,local_278,(ulong)local_310);
  if (((local_148._0_4_ & 0xfffffff7) == 2) && (local_148._4_4_ == 1)) {
    if (((data->set).field_0x8e6 & 1) != 0) {
      local_2f8._0_4_ = 1;
      iVar6 = setsockopt(local_348,6,1,&local_2f8,4);
      if (iVar6 < 0) {
        piVar11 = __errno_location();
        pcVar16 = Curl_strerror(*piVar11,(char *)local_248,0x100);
        Curl_infof(data,"Could not set TCP_NODELAY: %s",pcVar16);
      }
    }
    uVar8 = local_348;
    if (((data->set).field_0x8e6 & 0x40) != 0) {
      local_248[0] = 1;
      iVar6 = setsockopt(local_348,1,9,local_248,4);
      if (iVar6 < 0) {
        pcVar16 = "Failed to set SO_KEEPALIVE on fd %d";
      }
      else {
        local_248[0] = curlx_sltosi((long)(data->set).tcp_keepidle);
        iVar6 = setsockopt(uVar8,6,4,local_248,4);
        if (iVar6 < 0) {
          Curl_infof(data,"Failed to set TCP_KEEPIDLE on fd %d",(ulong)uVar8);
        }
        local_248[0] = curlx_sltosi((long)(data->set).tcp_keepintvl);
        iVar6 = setsockopt(uVar8,6,5,local_248,4);
        if (-1 < iVar6) goto LAB_00601073;
        pcVar16 = "Failed to set TCP_KEEPINTVL on fd %d";
      }
      Curl_infof(data,pcVar16,(ulong)uVar8);
    }
  }
LAB_00601073:
  if ((data->set).fsockopt == (curl_sockopt_callback)0x0) {
LAB_006010d2:
    local_318 = 0;
  }
  else {
    Curl_set_in_callback(data,true);
    uVar8 = local_348;
    iVar7 = (*(data->set).fsockopt)((data->set).sockopt_client,local_348,CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data,false);
    if (iVar7 == 0) goto LAB_006010d2;
    local_318 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    if (iVar7 != 2) {
      Curl_closesocket(data,conn,uVar8);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  local_31c = iVar7;
  if ((local_148._0_4_ & 0xfffffff7) != 2) goto LAB_0060175e;
  local_334 = local_348;
  uVar8 = Curl_ipv6_scope((sockaddr *)(local_148 + 0x10));
  local_330 = data->conn;
  local_328 = (Curl_dns_entry *)0x0;
  uVar15 = (data->set).localport;
  iVar7 = (data->set).localportrange;
  pcVar16 = (data->set).str[8];
  local_30c = 1;
  CVar5 = CURLE_OK;
  if (uVar15 != 0 || pcVar16 != (char *)0x0) {
    local_288 = 0;
    uStack_280 = 0;
    local_298 = 0;
    uStack_290 = 0;
    local_2a8 = 0;
    uStack_2a0 = 0;
    local_2b8 = 0;
    uStack_2b0 = 0;
    local_2c8 = 0;
    uStack_2c0 = 0;
    local_2d8 = 0;
    uStack_2d0 = 0;
    local_2e8 = 0;
    uStack_2e0 = 0;
    local_2f8.sa_family = 0;
    local_2f8.sa_data[0] = '\0';
    local_2f8.sa_data[1] = '\0';
    local_2f8.sa_data[2] = '\0';
    local_2f8.sa_data[3] = '\0';
    local_2f8.sa_data[4] = '\0';
    local_2f8.sa_data[5] = '\0';
    local_2f8.sa_data[6] = '\0';
    local_2f8.sa_data[7] = '\0';
    local_2f8.sa_data[8] = '\0';
    local_2f8.sa_data[9] = '\0';
    local_2f8.sa_data[10] = '\0';
    local_2f8.sa_data[0xb] = '\0';
    local_2f8.sa_data[0xc] = '\0';
    local_2f8.sa_data[0xd] = '\0';
    if ((pcVar16 == (char *)0x0) || (sVar12 = strlen(pcVar16), 0xfe < sVar12)) {
      if (local_148._0_4_ == 10) {
        local_354 = 0x1c;
        sVar4 = 10;
      }
      else {
        local_354 = 0;
        if (local_148._0_4_ != 2) goto LAB_00601598;
        local_354 = 0x10;
        sVar4 = 2;
      }
      local_2f8.sa_data._0_2_ = uVar15 << 8 | uVar15 >> 8;
      local_2f8.sa_family = sVar4;
    }
    else {
      memset(local_248,0,0x100);
      iVar6 = strncmp("if!",pcVar16,3);
      bVar20 = iVar6 == 0;
      if (bVar20) {
        bVar21 = false;
        lVar14 = 3;
      }
      else {
        iVar6 = strncmp("host!",pcVar16,5);
        bVar21 = iVar6 == 0;
        lVar14 = (ulong)bVar21 * 5;
      }
      pcVar16 = pcVar16 + lVar14;
      if (bVar21) {
LAB_00601253:
        iVar6 = 0;
LAB_00601255:
        if (!bVar20) {
          local_341 = local_330->ip_version;
          if (local_148._0_4_ == 2) {
            uVar3 = '\x01';
LAB_00601342:
            local_330->ip_version = uVar3;
          }
          else if (local_148._0_4_ == 10) {
            uVar3 = '\x02';
            goto LAB_00601342;
          }
          Curl_resolv(data,pcVar16,0,false,&local_328);
          local_330->ip_version = local_341;
          local_340 = pcVar16;
          if (local_328 == (Curl_dns_entry *)0x0) {
            bVar20 = true;
            iVar6 = -1;
          }
          else {
            Curl_printable_address(local_328->addr,(char *)local_248,0x100);
            Curl_infof(data,"Name \'%s\' family %i resolved to \'%s\' family %i",pcVar16,
                       (ulong)(uint)local_148._0_4_,local_248,
                       (ulong)(uint)local_328->addr->ai_family);
            Curl_resolv_unlock(data,local_328);
            bVar20 = local_328->addr->ai_family == local_148._0_4_;
            if (bVar20) {
              iVar6 = 1;
            }
          }
          pcVar16 = local_340;
          if (!bVar20) {
LAB_006014c3:
            CVar5 = CURLE_UNSUPPORTED_PROTOCOL;
            local_354 = 0;
            bVar20 = false;
            goto LAB_00601590;
          }
        }
        local_354 = 0;
        if (0 < iVar6) {
          if (local_148._0_4_ == 2) {
            local_340 = pcVar16;
            iVar10 = inet_pton(2,(char *)local_248,local_2f8.sa_data + 2);
            pcVar16 = local_340;
            if (0 < iVar10) {
              local_2f8.sa_data._0_2_ = uVar15 << 8 | uVar15 >> 8;
              local_2f8.sa_family = 2;
              local_354 = 0x10;
            }
          }
          else if (local_148._0_4_ == 10) {
            local_340 = pcVar16;
            pcVar16 = strchr((char *)local_248,0x25);
            if (pcVar16 == (char *)0x0) {
              pcVar19 = (char *)0x0;
            }
            else {
              pcVar19 = pcVar16 + 1;
              *pcVar16 = '\0';
            }
            iVar10 = inet_pton(10,(char *)local_248,local_2f8.sa_data + 6);
            local_354 = 0x1c;
            pcVar16 = local_340;
            if (0 < iVar10) {
              local_2f8.sa_data._0_2_ = uVar15 << 8 | uVar15 >> 8;
              local_2f8.sa_family = 10;
              if (pcVar19 != (char *)0x0) {
                iVar10 = atoi(pcVar19);
                uStack_2e0 = CONCAT44(uStack_2e0._4_4_,iVar10);
                pcVar16 = local_340;
              }
            }
          }
        }
        if (iVar6 < 1) {
          puVar1 = &(data->state).field_0x6d0;
          *puVar1 = *puVar1 & 0xf7;
          pcVar19 = "Couldn\'t bind to \'%s\'";
LAB_0060157e:
          Curl_failf(data,pcVar19,pcVar16);
          bVar20 = false;
          CVar5 = CURLE_INTERFACE_FAILED;
        }
        else {
          CVar5 = CURLE_UNSUPPORTED_PROTOCOL;
          bVar20 = true;
        }
      }
      else {
        sVar12 = strlen(pcVar16);
        iVar6 = setsockopt(local_334,1,0x19,pcVar16,(int)sVar12 + 1);
        if (iVar6 != 0) {
          local_340 = pcVar16;
          iVar9 = Curl_if2ip(local_148._0_4_,uVar8,local_330->scope_id,pcVar16,(char *)local_248,
                             0x100);
          pcVar16 = local_340;
          if (iVar9 == IF2IP_FOUND) {
            Curl_infof(data,"Local Interface %s is ip %s using address family %i",local_340,
                       local_248,(ulong)(uint)local_148._0_4_);
            bVar20 = true;
            iVar6 = 1;
            goto LAB_00601255;
          }
          if (iVar9 == IF2IP_AF_NOT_SUPPORTED) goto LAB_006014c3;
          if (iVar9 != IF2IP_NOT_FOUND) {
            iVar6 = 0;
            goto LAB_00601255;
          }
          if (!bVar20) goto LAB_00601253;
          local_354 = 0;
          pcVar19 = "Couldn\'t bind to interface \'%s\'";
          goto LAB_0060157e;
        }
        bVar20 = false;
        local_354 = 0;
        CVar5 = CURLE_OK;
      }
LAB_00601590:
      if (!bVar20) goto LAB_00601732;
    }
LAB_00601598:
    uVar8 = local_334;
    setsockopt(local_334,0,0x18,&local_30c,4);
    iVar6 = bind(uVar8,&local_2f8,local_354);
    local_308 = lVar17;
    uVar18 = uVar15;
    while (iVar6 < 0) {
      uVar18 = uVar18 + 1;
      if ((iVar7 < 2) || (uVar18 == 0)) {
        puVar13 = (uint *)__errno_location();
        uVar8 = *puVar13;
        (data->state).os_errno = uVar8;
        pcVar16 = Curl_strerror(uVar8,(char *)local_248,0x100);
        Curl_failf(data,"bind failed with errno %d: %s",(ulong)uVar8,pcVar16);
        CVar5 = CURLE_INTERFACE_FAILED;
        lVar17 = local_308;
        goto LAB_00601732;
      }
      Curl_infof(data,"Bind to local port %hu failed, trying next",(ulong)(uVar18 - 1));
      local_2f8.sa_data._0_2_ = uVar18 * 0x100 | uVar18 >> 8;
      iVar6 = bind(local_334,&local_2f8,local_354);
      uVar15 = uVar15 + 1;
      iVar7 = iVar7 + -1;
    }
    local_2fc = 0x80;
    local_b8.sa_family = 0;
    local_b8.sa_data[0] = '\0';
    local_b8.sa_data[1] = '\0';
    local_b8.sa_data[2] = '\0';
    local_b8.sa_data[3] = '\0';
    local_b8.sa_data[4] = '\0';
    local_b8.sa_data[5] = '\0';
    local_b8.sa_data[6] = '\0';
    local_b8.sa_data[7] = '\0';
    local_b8.sa_data[8] = '\0';
    local_b8.sa_data[9] = '\0';
    local_b8.sa_data[10] = '\0';
    local_b8.sa_data[0xb] = '\0';
    local_b8.sa_data[0xc] = '\0';
    local_b8.sa_data[0xd] = '\0';
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    iVar7 = getsockname(local_334,&local_b8,&local_2fc);
    lVar17 = local_308;
    if (iVar7 < 0) {
      puVar13 = (uint *)__errno_location();
      uVar8 = *puVar13;
      (data->state).os_errno = uVar8;
      pcVar16 = Curl_strerror(uVar8,(char *)local_248,0x100);
      Curl_failf(data,"getsockname() failed with errno %d: %s",(ulong)uVar8,pcVar16);
      CVar5 = CURLE_INTERFACE_FAILED;
    }
    else {
      CVar5 = CURLE_OK;
      Curl_infof(data,"Local port: %hu",(ulong)uVar15);
      puVar1 = &(local_330->bits).field_0x6;
      *puVar1 = *puVar1 | 0x80;
    }
  }
LAB_00601732:
  if (CVar5 != CURLE_OK) {
    Curl_closesocket(data,conn,local_348);
    if (CVar5 == CURLE_UNSUPPORTED_PROTOCOL) {
      return CURLE_COULDNT_CONNECT;
    }
    return CVar5;
  }
LAB_0060175e:
  curlx_nonblock(local_348,1);
  cVar22 = Curl_now();
  (conn->connecttime).tv_sec = cVar22.tv_sec;
  (conn->connecttime).tv_usec = cVar22.tv_usec;
  if (1 < conn->num_addr) {
    Curl_expire(data,conn->timeoutms_per_addr[0],EXPIRE_DNS_PER_NAME);
    Curl_expire(data,conn->timeoutms_per_addr[1],EXPIRE_DNS_PER_NAME2);
  }
  if (((char)local_318 == '\0') && (conn->transport != '\x04')) {
    if ((((conn->bits).field_0x7 & 2) != 0) &&
       (iVar7 = setsockopt(local_348,6,0x1e,&local_314,4), iVar7 < 0)) {
      Curl_infof(data,"Failed to enable TCP Fast Open on fd %d",(ulong)local_348);
    }
    iVar7 = connect(local_348,(sockaddr *)(local_148 + 0x10),local_148._12_4_);
    if (iVar7 == -1) {
      piVar11 = __errno_location();
      local_31c = *piVar11;
    }
    iVar6 = local_31c;
    CVar5 = CURLE_OK;
    bVar20 = true;
    if (((iVar7 == -1) && (local_31c != 0xb)) && (local_31c != 0x73)) {
      pcVar16 = Curl_strerror(local_31c,(char *)local_248,0x100);
      Curl_infof(data,"Immediate connect fail for %s: %s",local_278,pcVar16);
      (data->state).os_errno = iVar6;
      Curl_closesocket(data,conn,local_348);
      bVar20 = false;
      CVar5 = CURLE_COULDNT_CONNECT;
    }
    if (bVar20) {
      conn->tempsock[lVar17] = local_348;
    }
  }
  else {
    conn->tempsock[lVar17] = local_348;
    CVar5 = CURLE_OK;
  }
  return CVar5;
}

Assistant:

static CURLcode singleipconnect(struct Curl_easy *data,
                                struct connectdata *conn,
                                const struct Curl_addrinfo *ai,
                                int tempindex)
{
  struct Curl_sockaddr_ex addr;
  int rc = -1;
  int error = 0;
  bool isconnected = FALSE;
  curl_socket_t sockfd;
  CURLcode result;
  char ipaddress[MAX_IPADR_LEN];
  int port;
  bool is_tcp;
#ifdef TCP_FASTOPEN_CONNECT
  int optval = 1;
#endif
  const char *ipmsg;
  char buffer[STRERROR_LEN];
  curl_socket_t *sockp = &conn->tempsock[tempindex];
  *sockp = CURL_SOCKET_BAD;

  result = Curl_socket(data, ai, &addr, &sockfd);
  if(result)
    return result;

  /* store remote address and port used in this connection attempt */
  if(!Curl_addr2string((struct sockaddr*)&addr.sa_addr, addr.addrlen,
                       ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          errno, Curl_strerror(errno, buffer, sizeof(buffer)));
    Curl_closesocket(data, conn, sockfd);
    return CURLE_OK;
  }
#ifdef ENABLE_IPV6
  if(addr.family == AF_INET6)
    ipmsg = "  Trying [%s]:%d...";
  else
#endif
    ipmsg = "  Trying %s:%d...";
  infof(data, ipmsg, ipaddress, port);

#ifdef ENABLE_IPV6
  is_tcp = (addr.family == AF_INET || addr.family == AF_INET6) &&
    addr.socktype == SOCK_STREAM;
#else
  is_tcp = (addr.family == AF_INET) && addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    tcpnodelay(data, sockfd);

  nosigpipe(data, sockfd);

  Curl_sndbufset(sockfd);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    Curl_set_in_callback(data, true);
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data, false);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(data, conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  if(addr.family == AF_INET
#ifdef ENABLE_IPV6
     || addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(data, sockfd, addr.family,
                       Curl_ipv6_scope((struct sockaddr*)&addr.sa_addr));
    if(result) {
      Curl_closesocket(data, conn, sockfd); /* close socket and bail out */
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        return CURLE_COULDNT_CONNECT;
      }
      return result;
    }
  }

  /* set socket non-blocking */
  (void)curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_now();
  if(conn->num_addr > 1) {
    Curl_expire(data, conn->timeoutms_per_addr[0], EXPIRE_DNS_PER_NAME);
    Curl_expire(data, conn->timeoutms_per_addr[1], EXPIRE_DNS_PER_NAME2);
  }

  /* Connect TCP and QUIC sockets */
  if(!isconnected && (conn->transport != TRNSPRT_UDP)) {
    if(conn->bits.tcp_fastopen) {
#if defined(CONNECT_DATA_IDEMPOTENT) /* Darwin */
#  if defined(HAVE_BUILTIN_AVAILABLE)
      /* while connectx function is available since macOS 10.11 / iOS 9,
         it did not have the interface declared correctly until
         Xcode 9 / macOS SDK 10.13 */
      if(__builtin_available(macOS 10.11, iOS 9.0, tvOS 9.0, watchOS 2.0, *)) {
        sa_endpoints_t endpoints;
        endpoints.sae_srcif = 0;
        endpoints.sae_srcaddr = NULL;
        endpoints.sae_srcaddrlen = 0;
        endpoints.sae_dstaddr = &addr.sa_addr;
        endpoints.sae_dstaddrlen = addr.addrlen;

        rc = connectx(sockfd, &endpoints, SAE_ASSOCID_ANY,
                      CONNECT_RESUME_ON_READ_WRITE | CONNECT_DATA_IDEMPOTENT,
                      NULL, 0, NULL, NULL);
      }
      else {
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      }
#  else
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#  endif /* HAVE_BUILTIN_AVAILABLE */
#elif defined(TCP_FASTOPEN_CONNECT) /* Linux >= 4.11 */
      if(setsockopt(sockfd, IPPROTO_TCP, TCP_FASTOPEN_CONNECT,
                    (void *)&optval, sizeof(optval)) < 0)
        infof(data, "Failed to enable TCP Fast Open on fd %d", sockfd);

      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#elif defined(MSG_FASTOPEN) /* old Linux */
      if(conn->given->flags & PROTOPT_SSL)
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      else
        rc = 0; /* Do nothing */
#endif
    }
    else {
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    }

    if(-1 == rc)
      error = SOCKERRNO;
#ifdef ENABLE_QUIC
    else if(conn->transport == TRNSPRT_QUIC) {
      /* pass in 'sockfd' separately since it hasn't been put into the
         tempsock array at this point */
      result = Curl_quic_connect(data, conn, sockfd, tempindex,
                                 &addr.sa_addr, addr.addrlen);
      if(result)
        error = SOCKERRNO;
    }
#endif
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      result = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s",
            ipaddress, Curl_strerror(error, buffer, sizeof(buffer)));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(data, conn, sockfd);
      result = CURLE_COULDNT_CONNECT;
    }
  }

  if(!result)
    *sockp = sockfd;

  return result;
}